

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

void __thiscall lzham::lzham_decompressor::reset_huff_tables(lzham_decompressor *this)

{
  uint i_1;
  uint i;
  quasi_adaptive_huffman_data_model *in_stack_00000028;
  undefined4 local_10;
  undefined4 local_c;
  
  quasi_adaptive_huffman_data_model::reset(in_stack_00000028);
  quasi_adaptive_huffman_data_model::reset(in_stack_00000028);
  quasi_adaptive_huffman_data_model::reset(in_stack_00000028);
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    quasi_adaptive_huffman_data_model::reset(in_stack_00000028);
  }
  for (local_10 = 0; local_10 < 2; local_10 = local_10 + 1) {
    quasi_adaptive_huffman_data_model::reset(in_stack_00000028);
  }
  quasi_adaptive_huffman_data_model::reset(in_stack_00000028);
  return;
}

Assistant:

void lzham_decompressor::reset_huff_tables()
   {
      m_lit_table.reset();
     m_delta_lit_table.reset();
      
      m_main_table.reset();

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_rep_len_table); i++)
         m_rep_len_table[i].reset();

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_large_len_table); i++)
         m_large_len_table[i].reset();

      m_dist_lsb_table.reset();
   }